

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

uint CountTrailingZeros_32(uint32_t Value)

{
  undefined4 local_8;
  uint32_t Value_local;
  
  if (Value == 0) {
    local_8 = 0x20;
  }
  else {
    local_8 = 0;
    for (; (Value & 1) == 0; Value = Value >> 1 | 0x80000000) {
      local_8 = local_8 + 1;
    }
  }
  return local_8;
}

Assistant:

static inline unsigned CountTrailingZeros_32(uint32_t Value) {
#if __GNUC__ >= 4
	return Value ? __builtin_ctz(Value) : 32;
#else
	static const unsigned Mod37BitPosition[] = {
		32, 0, 1, 26, 2, 23, 27, 0, 3, 16, 24, 30, 28, 11, 0, 13,
		4, 7, 17, 0, 25, 22, 31, 15, 29, 10, 12, 6, 0, 21, 14, 9,
		5, 20, 8, 19, 18
	};
	// Replace "-Value" by "1+~Value" in the following commented code to avoid 
	// MSVC warning C4146
	//    return Mod37BitPosition[(-Value & Value) % 37];
	return Mod37BitPosition[((1 + ~Value) & Value) % 37];
#endif
}